

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions_detail.hpp
# Opt level: O3

Boxed_Value __thiscall
chaiscript::dispatch::detail::Do_Call<std::__cxx11::string>::
go<std::__cxx11::string(chaiscript::exception::eval_error_const&),chaiscript::dispatch::detail::Const_Caller<std::__cxx11::string,chaiscript::exception::eval_error>>
          (Do_Call<std::__cxx11::string> *this,
          Const_Caller<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::exception::eval_error>
          *fun,vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *params,
          Type_Conversions_State *t_conversions)

{
  Result_Type peVar1;
  code *pcVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  Boxed_Value BVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  
  peVar1 = boxed_cast<chaiscript::exception::eval_error_const&>
                     ((params->
                      super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
                      )._M_impl.super__Vector_impl_data._M_start,t_conversions);
  pcVar2 = (code *)fun->m_func;
  if (((ulong)pcVar2 & 1) != 0) {
    pcVar2 = *(code **)(pcVar2 + *(long *)(&peVar1->super_runtime_error + *(long *)&fun->field_0x8)
                                 + -1);
  }
  (*pcVar2)(&local_30,&peVar1->super_runtime_error + *(long *)&fun->field_0x8);
  BVar4 = Handle_Return<std::__cxx11::string>::handle<std::__cxx11::string,void>
                    ((Handle_Return<std::__cxx11::string> *)this,&local_30);
  _Var3._M_pi = BVar4.m_data.
                super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    _Var3._M_pi = extraout_RDX;
  }
  BVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var3._M_pi;
  BVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static Boxed_Value go(const Callable &fun, const std::vector<Boxed_Value> &params, const Type_Conversions_State &t_conversions)
          {
            return Handle_Return<Ret>::handle(call_func(Function_Signature<Signature>(), fun, params, t_conversions));
          }